

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.h
# Opt level: O3

void __thiscall
kj::_::
RunnableImpl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem-test.c++:497:3)>
::run(RunnableImpl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_kj_filesystem_test_c__:497:3)>
      *this)

{
  Directory *pDVar1;
  String *pSVar2;
  size_t sVar3;
  long *plVar4;
  ArrayPtr<const_kj::StringPtr> parts;
  Path local_58;
  undefined8 *local_40;
  long *local_38;
  StringPtr local_30;
  char *local_20;
  undefined8 local_18;
  
  pDVar1 = ((this->func).dir)->ptr;
  local_30.content.ptr = "bar";
  local_30.content.size_ = 4;
  local_20 = "baz";
  local_18 = 4;
  parts.size_ = 2;
  parts.ptr = &local_30;
  Path::Path(&local_58,parts);
  (*(pDVar1->super_ReadableDirectory).super_FsNode._vptr_FsNode[0xd])
            (&local_40,pDVar1,local_58.parts.ptr,local_58.parts.size_,1);
  plVar4 = local_38;
  if (local_38 != (long *)0x0) {
    local_38 = (long *)0x0;
    (**(code **)*local_40)(local_40,(long)plVar4 + *(long *)(*plVar4 + -0x10));
  }
  sVar3 = local_58.parts.size_;
  pSVar2 = local_58.parts.ptr;
  if (local_58.parts.ptr != (String *)0x0) {
    local_58.parts.ptr = (String *)0x0;
    local_58.parts.size_ = 0;
    (**(local_58.parts.disposer)->_vptr_ArrayDisposer)
              (local_58.parts.disposer,pSVar2,0x18,sVar3,sVar3,
               ArrayDisposer::Dispose_<kj::String,_false>::destruct);
  }
  return;
}

Assistant:

void run() override {
    func();
  }